

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

uint64_t __thiscall CConnman::CalculateKeyedNetGroup(CConnman *this,CAddress *address)

{
  CSipHasher *pCVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchNetGroup;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  CSipHasher local_78;
  CSipHasher local_40;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  NetGroupManager::GetGroup(&local_90,this->m_netgroupman,(CNetAddr *)address);
  CSipHasher::CSipHasher(&local_40,this->nSeed0,this->nSeed1);
  pCVar1 = CSipHasher::Write(&local_40,0x6c0edd8036ef4036);
  local_78.v[0] = pCVar1->v[0];
  local_78.v[1] = pCVar1->v[1];
  local_78.v[2] = pCVar1->v[2];
  local_78.v[3] = pCVar1->v[3];
  local_78.tmp = pCVar1->tmp;
  local_78.count = pCVar1->count;
  local_78._41_7_ = *(undefined7 *)&pCVar1->field_0x29;
  data.m_size = (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  data.m_data = local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pCVar1 = CSipHasher::Write(&local_78,data);
  uVar2 = CSipHasher::Finalize(pCVar1);
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t CConnman::CalculateKeyedNetGroup(const CAddress& address) const
{
    std::vector<unsigned char> vchNetGroup(m_netgroupman.GetGroup(address));

    return GetDeterministicRandomizer(RANDOMIZER_ID_NETGROUP).Write(vchNetGroup).Finalize();
}